

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall
Clasp::Constraint::minimize(Constraint *this,Solver *s,Literal p,CCMinRecursive *rec)

{
  bool bVar1;
  size_type sVar2;
  CCMinRecursive *rec_00;
  undefined4 in_EDX;
  undefined8 in_RSI;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_RDI;
  size_type i;
  LitVec temp;
  size_type sVar3;
  size_type local_48;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> local_30;
  undefined8 local_18;
  undefined4 local_8;
  byte local_1;
  
  local_18 = in_RSI;
  local_8 = in_EDX;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector(in_RDI);
  (**(code **)((in_RDI->ebo_).buf + 2))(in_RDI,local_18,local_8,&local_30);
  local_48 = 0;
  do {
    sVar3 = local_48;
    sVar2 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(&local_30);
    if (sVar3 == sVar2) {
      local_1 = 1;
LAB_001ef14a:
      bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1ef154);
      return (bool)(local_1 & 1);
    }
    rec_00 = (CCMinRecursive *)
             bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                       (&local_30,local_48);
    bVar1 = Solver::ccMinimize((Solver *)CONCAT44(sVar2,sVar3),
                               (Literal)(uint32)((ulong)in_RDI >> 0x20),rec_00);
    if (!bVar1) {
      local_1 = 0;
      goto LAB_001ef14a;
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

bool Constraint::minimize(Solver& s, Literal p, CCMinRecursive* rec) {
	LitVec temp;
	reason(s, p, temp);
	for (LitVec::size_type i = 0; i != temp.size(); ++i) {
		if (!s.ccMinimize(temp[i], rec)) {
			return false;
		}
	}
	return true;
}